

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O0

void highbd_warp_horizontal_filter
               (uint16_t *ref,__m128i *tmp,int stride,int32_t ix4,int32_t iy4,int32_t sx4,int alpha,
               int beta,int p_height,int height,int i,int offset_bits_horiz,int reduce_bits_horiz)

{
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  __m128i src2;
  __m128i src;
  int sx;
  int iy;
  int k;
  int local_70;
  int local_34;
  
  local_34 = -7;
  while( true ) {
    if (in_stack_00000018 - (int)src2[1] < 9) {
      local_70 = in_stack_00000018 - (int)src2[1];
    }
    else {
      local_70 = 8;
    }
    if (local_70 <= local_34) break;
    highbd_horiz_filter((__m128i *)CONCAT44(src2[0]._4_4_,(undefined4)src2[0]),
                        (__m128i *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                        (__m128i *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,
                        in_stack_00000008,unaff_retaddr,(int)src[0],(int)src[1]);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

static inline void highbd_warp_horizontal_filter(
    const uint16_t *ref, __m128i *tmp, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const int offset_bits_horiz, const int reduce_bits_horiz) {
  int k;
  for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
    int iy = iy4 + k;
    if (iy < 0)
      iy = 0;
    else if (iy > height - 1)
      iy = height - 1;
    int sx = sx4 + beta * (k + 4);

    // Load source pixels
    const __m128i src =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    const __m128i src2 =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 + 1));

    highbd_horiz_filter(&src, &src2, tmp, sx, alpha, k, offset_bits_horiz,
                        reduce_bits_horiz);
  }
}